

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O3

_Bool ts_subtree_external_scanner_state_eq(Subtree self,Subtree other)

{
  _Bool _Var1;
  int iVar2;
  ExternalScannerState *b;
  ExternalScannerState *a;
  
  a = &empty_state;
  if (((self.ptr != (SubtreeHeapData *)0x0) && (a = &empty_state, ((ulong)self.ptr & 1) == 0)) &&
     (a = &empty_state, ((self.ptr)->field_0x2c & 0x40) != 0)) {
    a = &empty_state;
    if ((self.ptr)->child_count == 0) {
      a = (ExternalScannerState *)&(self.ptr)->field_17;
    }
  }
  if (((other.ptr != (SubtreeHeapData *)0x0) && (((ulong)other.ptr & 1) == 0)) &&
     (((other.ptr)->field_0x2c & 0x40) != 0)) {
    b = &empty_state;
    if ((other.ptr)->child_count == 0) {
      b = (ExternalScannerState *)&(other.ptr)->field_17;
    }
    _Var1 = ts_external_scanner_state_eq(a,b);
    return _Var1;
  }
  if (a == &empty_state) {
    return true;
  }
  if (a->length != 0) {
    return false;
  }
  iVar2 = bcmp(a,&empty_state,(ulong)a->length);
  return iVar2 == 0;
}

Assistant:

bool ts_subtree_external_scanner_state_eq(Subtree self, Subtree other) {
  const ExternalScannerState *state1 = &empty_state;
  const ExternalScannerState *state2 = &empty_state;
  if (self.ptr && ts_subtree_has_external_tokens(self) && !self.ptr->child_count) {
    state1 = &self.ptr->external_scanner_state;
  }
  if (other.ptr && ts_subtree_has_external_tokens(other) && !other.ptr->child_count) {
    state2 = &other.ptr->external_scanner_state;
  }
  return ts_external_scanner_state_eq(state1, state2);
}